

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O0

void __thiscall MT32Emu::Poly::partialDeactivated(Poly *this,Partial *partial)

{
  Synth *pSVar1;
  int local_1c;
  int i;
  Partial *partial_local;
  Poly *this_local;
  
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    if (this->partials[local_1c] == partial) {
      this->partials[local_1c] = (Partial *)0x0;
      this->activePartialCount = this->activePartialCount - 1;
    }
  }
  if (this->activePartialCount == 0) {
    setState(this,POLY_Inactive);
    pSVar1 = Part::getSynth(this->part);
    if (pSVar1->abortingPoly == this) {
      pSVar1 = Part::getSynth(this->part);
      pSVar1->abortingPoly = (Poly *)0x0;
    }
  }
  Part::partialDeactivated(this->part,this);
  return;
}

Assistant:

void Poly::partialDeactivated(Partial *partial) {
	for (int i = 0; i < 4; i++) {
		if (partials[i] == partial) {
			partials[i] = NULL;
			activePartialCount--;
		}
	}
	if (activePartialCount == 0) {
		setState(POLY_Inactive);
		if (part->getSynth()->abortingPoly == this) {
			part->getSynth()->abortingPoly = NULL;
		}
	}
	part->partialDeactivated(this);
}